

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void ExpectedError(string *TestCase,JSONErrorType Raised,JSONErrorType Expected)

{
  ostream *poVar1;
  string local_88;
  string local_68;
  string local_38;
  JSONErrorType local_18;
  JSONErrorType local_14;
  JSONErrorType Expected_local;
  JSONErrorType Raised_local;
  string *TestCase_local;
  
  local_18 = Expected;
  local_14 = Raised;
  _Expected_local = TestCase;
  if (Raised == Expected) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Case: ");
    poVar1 = std::operator<<(poVar1,(string *)TestCase);
    poVar1 = std::operator<<(poVar1,": The raised exception is equal the expected one! ENUM: ");
    GetEnumName_abi_cxx11_(&local_38,local_14);
    poVar1 = std::operator<<(poVar1,(string *)&local_38);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Case: ");
    poVar1 = std::operator<<(poVar1,(string *)TestCase);
    poVar1 = std::operator<<(poVar1,": Raised: ");
    GetEnumName_abi_cxx11_(&local_68,local_14);
    poVar1 = std::operator<<(poVar1,(string *)&local_68);
    poVar1 = std::operator<<(poVar1," != Expected: ");
    GetEnumName_abi_cxx11_(&local_88,local_18);
    poVar1 = std::operator<<(poVar1,(string *)&local_88);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

void ExpectedError(string TestCase, JSONErrorType Raised, JSONErrorType Expected)
{
    if(Raised == Expected)
        cout << "Case: " << TestCase << ": The raised exception is equal the expected one! ENUM: " << GetEnumName(Raised) << endl;
    else
        cout << "Case: " << TestCase << ": Raised: " << GetEnumName(Raised) << " != Expected: " << GetEnumName(Expected) << endl;
}